

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs.c
# Opt level: O2

FFSEncodeVector fixup_output_vector(FFSBuffer b,estate s)

{
  uint uVar1;
  void *pvVar2;
  internal_iovec *piVar3;
  ssize_t sVar4;
  ulong uVar5;
  undefined8 *puVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  FFSEncodeVector pFVar10;
  
  sVar4 = add_to_tmp_buffer(b,(long)(s->iovcnt * 0x10 + 0x50));
  lVar7 = 0;
  if (sVar4 == -1) {
    pFVar10 = (FFSEncodeVector)0x0;
  }
  else {
    uVar5 = sVar4 + 0xfU & 0xfffffffffffffff0;
    pvVar2 = b->tmp_buffer;
    pFVar10 = (FFSEncodeVector)((long)pvVar2 + uVar5 + 0x30);
    uVar1 = s->iovcnt;
    uVar8 = 0;
    if (0 < (int)uVar1) {
      uVar8 = (ulong)uVar1;
    }
    puVar6 = (undefined8 *)((long)pvVar2 + uVar5 + 0x38);
    for (; uVar8 * 0x18 - lVar7 != 0; lVar7 = lVar7 + 0x18) {
      piVar3 = s->iovec;
      *puVar6 = *(undefined8 *)((long)&piVar3->iov_len + lVar7);
      lVar9 = *(long *)((long)&piVar3->iov_base + lVar7);
      if (lVar9 == 0) {
        lVar9 = *(long *)((long)&piVar3->iov_offset + lVar7) + (long)pvVar2;
      }
      puVar6[-1] = lVar9;
      puVar6 = puVar6 + 2;
    }
    pFVar10[(int)uVar1].iov_base = (void *)0x0;
    pFVar10[(int)uVar1].iov_len = 0;
    if (s->iovec_is_stack == 0) {
      free(s->iovec);
      s->iovec = (internal_iovec *)0x0;
    }
    if ((s->addr_list_is_stack == 0) && (s->addr_list != (addr_list_entry *)0x0)) {
      free(s->addr_list);
      s->addr_list = (addr_list_entry *)0x0;
    }
  }
  return pFVar10;
}

Assistant:

static FFSEncodeVector
fixup_output_vector(FFSBuffer b, estate s)
{
    int size = (s->iovcnt + 5) * sizeof(struct FFSEncodeVec);
    ssize_t tmp_vec_offset = add_to_tmp_buffer(b, size);
    FFSEncodeVector ret;
    /* buffer will not be realloc'd after this */
    int i;

    if (tmp_vec_offset == -1) return NULL;

    tmp_vec_offset += sizeof(ret[0]) - 1;
    tmp_vec_offset -= tmp_vec_offset % sizeof(ret[0]);
    ret = (FFSEncodeVector)(((char*)b->tmp_buffer) + tmp_vec_offset);
    /* leave two blanks, see notes in ffs_file.c */
    /* the upshot is that we use these if we need to add headers */
    ret += 3;
    for (i=0; i < s->iovcnt; i++) {
	ret[i].iov_len = s->iovec[i].iov_len;
	if (s->iovec[i].iov_base != NULL) {
	    ret[i].iov_base = s->iovec[i].iov_base;
	} else {
	    ret[i].iov_base = ((char*)b->tmp_buffer) + s->iovec[i].iov_offset;
	}
    }
    ret[s->iovcnt].iov_base = NULL;
    ret[s->iovcnt].iov_len = 0;
    if (!s->iovec_is_stack) {
	free(s->iovec);
	s->iovec = NULL;
    }
    if (!s->addr_list_is_stack && (s->addr_list != NULL)) {
	free(s->addr_list);
	s->addr_list = NULL;
    }
    return ret;
}